

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O0

void avro::codec_traits<unsigned_int>::decode(Decoder *d,uint32_t *v)

{
  reference pvVar1;
  undefined4 *in_RSI;
  long *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  undefined4 *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x28aaed);
  (**(code **)(*local_8 + 0x68))(local_8,4,&local_28);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
  *local_10 = *(undefined4 *)pvVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

static void decode(Decoder& d, uint32_t& v) {
        std::vector <uint8_t> value;
        d.decodeFixed(sizeof(uint32_t),value);
        memcpy(&v,&(value[0]),sizeof(uint32_t));
    }